

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

void __thiscall
cmGraphVizWriter::FindAllConnections
          (cmGraphVizWriter *this,ConnectionsMap *connectionMap,cmLinkItem *rootItem,
          Connections *extendedCons,
          set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *visitedItems)

{
  cmLinkItem *__k;
  pointer pCVar1;
  const_iterator cVar2;
  mapped_type *pmVar3;
  iterator iVar4;
  Connection *con;
  pointer __args;
  
  cVar2 = std::
          _Rb_tree<cmLinkItem,_std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>,_std::_Select1st<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
          ::find(&connectionMap->_M_t,rootItem);
  if ((_Rb_tree_header *)cVar2._M_node != &(connectionMap->_M_t)._M_impl.super__Rb_tree_header) {
    pmVar3 = std::
             map<cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
             ::at(connectionMap,rootItem);
    __args = (pmVar3->
             super__Vector_base<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pCVar1 = (pmVar3->
             super__Vector_base<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (__args != pCVar1) {
      do {
        std::vector<cmGraphVizWriter::Connection,std::allocator<cmGraphVizWriter::Connection>>::
        emplace_back<cmGraphVizWriter::Connection_const&>
                  ((vector<cmGraphVizWriter::Connection,std::allocator<cmGraphVizWriter::Connection>>
                    *)extendedCons,__args);
        __k = &__args->dst;
        iVar4 = std::
                _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                ::find(&visitedItems->_M_t,__k);
        if ((_Rb_tree_header *)iVar4._M_node == &(visitedItems->_M_t)._M_impl.super__Rb_tree_header)
        {
          std::
          _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
          ::_M_insert_unique<cmLinkItem_const&>
                    ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                      *)visitedItems,__k);
          FindAllConnections(this,connectionMap,__k,extendedCons,visitedItems);
        }
        __args = __args + 1;
      } while (__args != pCVar1);
    }
  }
  return;
}

Assistant:

void cmGraphVizWriter::FindAllConnections(const ConnectionsMap& connectionMap,
                                          const cmLinkItem& rootItem,
                                          Connections& extendedCons,
                                          std::set<cmLinkItem>& visitedItems)
{
  // some "targets" are not in map, e.g. linker flags as -lm or
  // targets without dependency.
  // in both cases we are finished with traversing the graph
  if (connectionMap.find(rootItem) == connectionMap.cend()) {
    return;
  }

  const Connections& origCons = connectionMap.at(rootItem);

  for (const Connection& con : origCons) {
    extendedCons.emplace_back(con);
    const cmLinkItem& dstItem = con.dst;
    bool const visited = visitedItems.find(dstItem) != visitedItems.cend();
    if (!visited) {
      visitedItems.insert(dstItem);
      this->FindAllConnections(connectionMap, dstItem, extendedCons,
                               visitedItems);
    }
  }
}